

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLTokenizer.cpp
# Opt level: O2

TokenListType * __thiscall
Diligent::Parsing::HLSLTokenizer::Tokenize
          (TokenListType *__return_storage_ptr__,HLSLTokenizer *this,String *Source)

{
  _List_node_base **__lhs;
  char cVar1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  __type _Var5;
  uint uVar6;
  iterator __tmp;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  const_iterator cVar9;
  long *plVar10;
  undefined8 *puVar11;
  HLSLTokenType Type;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var12;
  long lVar13;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  LiteralStart;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  DelimStart;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  LiteralEnd;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  DelimEnd;
  anon_class_8_1_a9fb7fa2 local_100;
  undefined1 local_f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  size_t local_b0;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_a8;
  pointer local_a0;
  anon_class_32_4_dc8a26e2 AddDoubleCharToken;
  string _msg;
  size_t TokenIdx;
  
  local_100.TokenIdx = &TokenIdx;
  TokenIdx = 0;
  pcVar2 = (Source->_M_dataplus)._M_p;
  local_128._M_current = pcVar2 + Source->_M_string_length;
  (__return_storage_ptr__->
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  )._M_impl._M_node._M_size = 0;
  local_f8._8_8_ = &local_e0;
  local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
  local_f8._16_8_ = 0;
  local_e0._M_local_buf[0] = '\0';
  local_d0._M_p = (pointer)&local_c0;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_b0 = 0xffffffffffffffff;
  local_a8 = (_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)this;
  local_a0 = pcVar2;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace_back<Diligent::Parsing::HLSLTokenInfo>(__return_storage_ptr__,(HLSLTokenInfo *)local_f8);
  HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)local_f8);
  Pos._M_current = pcVar2;
LAB_00358af4:
  DelimStart = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )Pos._M_current;
  if (Pos._M_current != local_128._M_current) {
    _Var7 = SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (&Pos,&local_128,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
    _Var12._M_current = DelimStart._M_current;
    LiteralEnd = DelimStart;
    Pos = _Var7;
    LiteralStart = _Var7;
    DelimEnd = _Var7;
    if (local_128._M_current != _Var7._M_current) {
      AddDoubleCharToken.DelimStart = &DelimStart;
      AddDoubleCharToken.DelimEnd = &DelimEnd;
      cVar1 = *_Var7._M_current;
      AddDoubleCharToken.Tokens = __return_storage_ptr__;
      AddDoubleCharToken.Pos = &Pos;
      switch(cVar1) {
      case '!':
        Pos._M_current = _Var7._M_current + 1;
        Type = LogicOp;
        break;
      case '\"':
        LiteralStart._M_current = _Var7._M_current + 1;
        Pos._M_current = LiteralStart._M_current;
        while( true ) {
          _Var12._M_current = Pos._M_current;
          if (_Var12._M_current == local_128._M_current) goto LAB_00359193;
          Pos._M_current = _Var12._M_current + 1;
          if (*_Var12._M_current == '\"') break;
          if (*_Var12._M_current == '\0') {
LAB_00359193:
            Pos._M_current = _Var12._M_current;
            plVar10 = (long *)__cxa_allocate_exception(0x10);
            *plVar10 = (long)(LiteralStart._M_current + -1);
            plVar10[1] = (long)"Unable to find matching closing quotes.";
            __cxa_throw(plVar10,&std::
                                 pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                 ::typeinfo,0);
          }
        }
        Type = StringConstant;
        LiteralEnd._M_current = _Var12._M_current;
        break;
      case '#':
        do {
          Pos._M_current = Pos._M_current + 1;
          if (Pos._M_current == local_128._M_current) goto LAB_00359165;
          cVar1 = *Pos._M_current;
        } while ((cVar1 == '\t') || (cVar1 == ' '));
        if ((cVar1 == '\0') || (cVar1 == '\n')) {
LAB_00359165:
          puVar11 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar11 = LiteralStart._M_current;
          puVar11[1] = "Missing preprocessor directive.";
          __cxa_throw(puVar11,&std::
                               pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               ::typeinfo,0);
        }
        if (cVar1 == '/') {
          puVar11 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar11 = LiteralStart._M_current;
          puVar11[1] = "Comments between # and preprocessor directive are currently not supported.";
          __cxa_throw(puVar11,&std::
                               pair<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               ::typeinfo,0);
        }
        Pos = SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (&Pos,&local_128);
        Type = PreprocessorDirective;
        break;
      case '$':
      case '\'':
      case '.':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
switchD_00358b88_caseD_24:
        Pos = SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (&Pos,&local_128);
        if (LiteralStart._M_current == Pos._M_current) {
          Pos = SkipFloatNumber<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          (&Pos,&local_128);
          if (LiteralStart._M_current == Pos._M_current) {
            Pos._M_current = Pos._M_current + 1;
            Type = Undefined;
          }
          else {
            Type = NumericConstant;
          }
        }
        else {
          local_f8._0_8_ = local_f8 + 0x10;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)local_f8,LiteralStart._M_current,Pos._M_current);
          HashMapStringKey::HashMapStringKey((HashMapStringKey *)&_msg,(Char *)local_f8._0_8_,true);
          cVar9 = std::
                  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(local_a8,(key_type *)&_msg);
          HashMapStringKey::Clear((HashMapStringKey *)&_msg);
          std::__cxx11::string::~string((string *)local_f8);
          if (cVar9.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>,_false>
              ._M_cur == (__node_type *)0x0) {
            Type = Identifier;
          }
          else {
            local_f8._0_8_ = local_f8 + 0x10;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)local_f8,LiteralStart._M_current,Pos._M_current);
            _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_f8,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)cVar9.
                                              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>,_false>
                                              ._M_cur + 0x20));
            std::__cxx11::string::~string((string *)local_f8);
            if (!_Var5) {
              FormatString<char[21]>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8,(char (*) [21])"Inconsistent literal");
              DebugAssertionFailed
                        ((Char *)local_f8._0_8_,"operator()",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLTokenizer.cpp"
                         ,0x3f);
              std::__cxx11::string::~string((string *)local_f8);
            }
            Type = *(HLSLTokenType *)
                    ((long)cVar9.
                           super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>,_false>
                           ._M_cur + 0x18);
            if (*(HLSLTokenType *)
                 ((long)cVar9.
                        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::Parsing::HLSLTokenInfo>,_false>
                        ._M_cur + 0x18) == Undefined) {
              Type = Identifier;
            }
          }
        }
        break;
      case '%':
      case '*':
      case '/':
LAB_00358b93:
        Pos._M_current = Pos._M_current + 1;
        Type = MathOp;
        break;
      case '&':
switchD_00358b88_caseD_26:
        bVar4 = Tokenize<Diligent::Parsing::HLSLTokenInfo,_std::__cxx11::list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLTokenizer.cpp:50:13),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLTokenizer.cpp:58:13)>
                ::anon_class_32_4_29b87129::
                operator()<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::anon_class_32_4_dc8a26e2::operator()(&AddDoubleCharToken,LogicOp);
        if (!bVar4) {
LAB_00358cb6:
          Pos._M_current = Pos._M_current + 1;
          Type = BitwiseOp;
          break;
        }
        goto LAB_003590bd;
      case '(':
        Pos._M_current = _Var7._M_current + 1;
        Type = OpenParen;
        break;
      case ')':
        Pos._M_current = _Var7._M_current + 1;
        Type = ClosingParen;
        break;
      case '+':
      case '-':
        bVar4 = Tokenize<Diligent::Parsing::HLSLTokenInfo,_std::__cxx11::list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLTokenizer.cpp:50:13),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLTokenizer.cpp:58:13)>
                ::anon_class_32_4_29b87129::
                operator()<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::anon_class_32_4_dc8a26e2::operator()(&AddDoubleCharToken,IncDecOp);
        if (bVar4) goto LAB_003590bd;
        if (((((__return_storage_ptr__->
               super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
               )._M_impl._M_node.super__List_node_base._M_next !=
               (_List_node_base *)__return_storage_ptr__) &&
             (uVar6 = *(int *)&(__return_storage_ptr__->
                               super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                               )._M_impl._M_node.super__List_node_base._M_prev[1]._M_next - 0x136,
             uVar6 < 7)) && ((0x65U >> (uVar6 & 0x1f) & 1) != 0)) ||
           (_Var8 = SkipFloatNumber<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                              (&Pos,&local_128), Pos._M_current == _Var8._M_current))
        goto LAB_00358b93;
        Type = NumericConstant;
        Pos = _Var8;
        break;
      case ',':
        Pos._M_current = _Var7._M_current + 1;
        Type = Comma;
        break;
      case ':':
        bVar4 = Tokenize<Diligent::Parsing::HLSLTokenInfo,_std::__cxx11::list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLTokenizer.cpp:50:13),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLTokenizer.cpp:58:13)>
                ::anon_class_32_4_29b87129::
                operator()<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::anon_class_32_4_dc8a26e2::operator()(&AddDoubleCharToken,DoubleColon);
        if (bVar4) goto LAB_003590bd;
        Type = Colon;
        Pos._M_current = Pos._M_current + 1;
        break;
      case ';':
        Type = Semicolon;
        Pos._M_current = _Var7._M_current + 1;
        break;
      case '<':
      case '>':
        bVar4 = Tokenize<Diligent::Parsing::HLSLTokenInfo,_std::__cxx11::list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLTokenizer.cpp:50:13),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLTokenizer.cpp:58:13)>
                ::anon_class_32_4_29b87129::
                operator()<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::anon_class_32_4_dc8a26e2::operator()(&AddDoubleCharToken,BitwiseOp);
        if (bVar4) goto LAB_003590bd;
        Type = ComparisonOp;
        Pos._M_current = Pos._M_current + 1;
        break;
      case '=':
        if (DelimStart._M_current != _Var7._M_current ||
            (__return_storage_ptr__->
            super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
            )._M_impl._M_node.super__List_node_base._M_next ==
            (_List_node_base *)__return_storage_ptr__) {
LAB_00359060:
          Type = Assignment;
          Pos._M_current = Pos._M_current + 1;
          break;
        }
        p_Var3 = (__return_storage_ptr__->
                 super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                 )._M_impl._M_node.super__List_node_base._M_prev;
        __lhs = &p_Var3[1]._M_prev;
        lVar13 = 0;
        do {
          if (lVar13 == 0x50) {
            lVar13 = 0;
            goto LAB_00358ff3;
          }
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,*(char **)((long)&DAT_00a5af00 + lVar13));
          lVar13 = lVar13 + 8;
        } while (!bVar4);
        *(undefined4 *)&p_Var3[1]._M_next = 0x144;
        std::__cxx11::string::
        append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)__lhs,Pos,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(Pos._M_current + 1));
        goto LAB_00359036;
      case '?':
        Type = QuestionMark;
        Pos._M_current = _Var7._M_current + 1;
        break;
      default:
        switch(cVar1) {
        case '{':
          Pos._M_current = _Var7._M_current + 1;
          Type = OpenBrace;
          break;
        case '|':
          goto switchD_00358b88_caseD_26;
        case '}':
          Pos._M_current = _Var7._M_current + 1;
          Type = ClosingBrace;
          break;
        case '~':
switchD_00358bb3_caseD_7e:
          goto LAB_00358cb6;
        default:
          if (cVar1 == '[') {
            Type = OpenSquareBracket;
            Pos._M_current = _Var7._M_current + 1;
          }
          else {
            if (cVar1 != ']') {
              if (cVar1 != '^') goto switchD_00358b88_caseD_24;
              goto switchD_00358bb3_caseD_7e;
            }
            Type = ClosingSquareBracket;
            Pos._M_current = _Var7._M_current + 1;
          }
        }
      }
      if (_Var12._M_current == DelimStart._M_current) {
        LiteralEnd = Pos;
      }
      Tokenize::anon_class_8_1_a9fb7fa2::operator()
                ((HLSLTokenInfo *)local_f8,&local_100,Type,&DelimStart,&DelimEnd,&LiteralStart,
                 &LiteralEnd);
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      push_back(__return_storage_ptr__,(HLSLTokenInfo *)local_f8);
      HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)local_f8);
      goto LAB_003590bd;
    }
    Tokenize::anon_class_8_1_a9fb7fa2::operator()
              ((HLSLTokenInfo *)local_f8,&local_100,Undefined,&DelimStart,&DelimEnd,&LiteralStart,
               &Pos);
    std::__cxx11::
    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
    push_back(__return_storage_ptr__,(value_type *)local_f8);
    HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)local_f8);
  }
  return __return_storage_ptr__;
  while( true ) {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,*(char **)((long)&DAT_00a5af50 + lVar13));
    lVar13 = lVar13 + 8;
    if (bVar4) break;
LAB_00358ff3:
    if (lVar13 == 0x20) goto LAB_00359060;
  }
  *(undefined4 *)&p_Var3[1]._M_next = 0x145;
  std::__cxx11::string::append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)__lhs,Pos,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(Pos._M_current + 1));
LAB_00359036:
  Pos._M_current = Pos._M_current + 1;
LAB_003590bd:
  if (Pos._M_current == local_128._M_current) {
    return __return_storage_ptr__;
  }
  if (_Var7._M_current == Pos._M_current) {
    FormatString<char[46]>
              ((string *)local_f8,(char (*) [46])"Position has not been updated by the handler.");
    DebugAssertionFailed
              ((Char *)local_f8._0_8_,"SplitString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
               ,0x1e8);
    std::__cxx11::string::~string((string *)local_f8);
  }
  goto LAB_00358af4;
}

Assistant:

HLSLTokenizer::TokenListType HLSLTokenizer::Tokenize(const String& Source) const
{
    try
    {
        size_t TokenIdx = 0;
        return Parsing::Tokenize<HLSLTokenInfo, TokenListType>(
            Source.begin(), Source.end(),
            [&TokenIdx](HLSLTokenType                      Type,
                        const std::string::const_iterator& DelimStart,
                        const std::string::const_iterator& DelimEnd,
                        const std::string::const_iterator& LiteralStart,
                        const std::string::const_iterator& LiteralEnd) //
            {
                return HLSLTokenInfo::Create(Type, DelimStart, DelimEnd, LiteralStart, LiteralEnd, TokenIdx++);
            },
            [&](const std::string::const_iterator& Start, const std::string::const_iterator& End) //
            {
                auto KeywordIt = m_Keywords.find(HashMapStringKey{std::string{Start, End}});
                if (KeywordIt != m_Keywords.end())
                {
                    VERIFY(std::string(Start, End) == KeywordIt->second.Literal, "Inconsistent literal");
                    return KeywordIt->second.Type;
                }
                return HLSLTokenType::Identifier;
            });
    }
    catch (...)
    {
        return {};
    }
}